

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O1

void Gia_ManPerformOneIter(Gia_ManEra_t *p)

{
  uint uVar1;
  Gia_Man_t *pGVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  uint *puVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  
  pGVar2 = p->pAig;
  uVar9 = (ulong)(uint)pGVar2->nObjs;
  if (1 < pGVar2->nObjs) {
    pGVar3 = pGVar2->pObjs;
    lVar7 = 1;
    do {
      uVar4 = *(ulong *)(pGVar3 + lVar7);
      uVar11 = (uint)uVar4;
      iVar6 = (int)lVar7;
      if ((uVar4 & 0x1fffffff) == 0x1fffffff || (int)uVar11 < 0) {
        if ((int)uVar11 < 0 && (int)(uVar4 & 0x1fffffff) != 0x1fffffff) {
          if ((int)uVar9 <= lVar7) goto LAB_00694b08;
          puVar5 = p->pDataSim;
          uVar1 = p->nWordsSim;
          if ((uVar11 >> 0x1d & 1) == 0) {
            if (0 < (int)uVar1) {
              lVar12 = (ulong)uVar1 + 1;
              do {
                puVar5[(long)(int)(uVar1 * iVar6) + lVar12 + -2] =
                     puVar5[(long)(int)((iVar6 - (uVar11 & 0x1fffffff)) * uVar1) + lVar12 + -2];
                lVar12 = lVar12 + -1;
              } while (1 < lVar12);
            }
          }
          else if (0 < (int)uVar1) {
            lVar12 = (ulong)uVar1 + 1;
            do {
              puVar5[(long)(int)(uVar1 * iVar6) + lVar12 + -2] =
                   ~puVar5[(long)(int)((iVar6 - (uVar11 & 0x1fffffff)) * uVar1) + lVar12 + -2];
              lVar12 = lVar12 + -1;
            } while (1 < lVar12);
          }
        }
      }
      else {
        if ((int)uVar9 <= lVar7) {
LAB_00694b08:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        puVar5 = p->pDataSim;
        uVar1 = p->nWordsSim;
        uVar9 = (ulong)uVar1;
        uVar10 = uVar11 & 0x1fffffff;
        uVar8 = (uint)(uVar4 >> 0x20) & 0x1fffffff;
        if ((uVar11 >> 0x1d & 1) == 0) {
          if ((uVar4 >> 0x3d & 1) == 0) {
            if (0 < (int)uVar1) {
              lVar12 = uVar9 + 1;
              do {
                puVar5[(long)(int)(uVar1 * iVar6) + lVar12 + -2] =
                     puVar5[(long)(int)((iVar6 - uVar8) * uVar1) + lVar12 + -2] &
                     puVar5[(long)(int)((iVar6 - uVar10) * uVar1) + lVar12 + -2];
                lVar12 = lVar12 + -1;
              } while (1 < lVar12);
            }
          }
          else if (0 < (int)uVar1) {
            lVar12 = uVar9 + 1;
            do {
              puVar5[(long)(int)(uVar1 * iVar6) + lVar12 + -2] =
                   ~puVar5[(long)(int)((iVar6 - uVar8) * uVar1) + lVar12 + -2] &
                   puVar5[(long)(int)((iVar6 - uVar10) * uVar1) + lVar12 + -2];
              lVar12 = lVar12 + -1;
            } while (1 < lVar12);
          }
        }
        else if ((uVar4 >> 0x3d & 1) == 0) {
          if (0 < (int)uVar1) {
            lVar12 = uVar9 + 1;
            do {
              puVar5[(long)(int)(uVar1 * iVar6) + lVar12 + -2] =
                   ~puVar5[(long)(int)((iVar6 - uVar10) * uVar1) + lVar12 + -2] &
                   puVar5[(long)(int)((iVar6 - uVar8) * uVar1) + lVar12 + -2];
              lVar12 = lVar12 + -1;
            } while (1 < lVar12);
          }
        }
        else if (0 < (int)uVar1) {
          lVar12 = uVar9 + 1;
          do {
            puVar5[(long)(int)(uVar1 * iVar6) + lVar12 + -2] =
                 ~(puVar5[(long)(int)((iVar6 - uVar8) * uVar1) + lVar12 + -2] |
                  puVar5[(long)(int)((iVar6 - uVar10) * uVar1) + lVar12 + -2]);
            lVar12 = lVar12 + -1;
          } while (1 < lVar12);
        }
      }
      lVar7 = lVar7 + 1;
      uVar9 = (ulong)pGVar2->nObjs;
    } while (lVar7 < (long)uVar9);
  }
  return;
}

Assistant:

void Gia_ManPerformOneIter( Gia_ManEra_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj1( p->pAig, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Gia_ManSimulateNode( p, pObj );
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ManSimulateCo( p, pObj );
    }
}